

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_resources.cpp
# Opt level: O0

bool dxil_spv::emit_interpolate_instruction(GLSLstd450 opcode,Impl *impl,CallInst *instruction)

{
  Builder *pBVar1;
  CallInst *pCVar2;
  bool bVar3;
  Id IVar4;
  Operation *pOVar5;
  Value *pVVar6;
  Constant *this;
  APInt *this_00;
  int64_t iVar7;
  Operation *op;
  float off;
  ConstantInt *constant_operand;
  Value *operand;
  uint i;
  bool is_non_const;
  Id offsets [2];
  Id aux_id;
  initializer_list<unsigned_int> local_60;
  Operation *local_50;
  Operation *op_1;
  Id local_40;
  uint32_t num_rows;
  uint32_t ptr_id;
  uint32_t var_id;
  mapped_type *meta;
  Builder *pBStack_28;
  uint32_t input_element_index;
  Builder *builder;
  CallInst *instruction_local;
  Impl *impl_local;
  GLSLstd450 opcode_local;
  
  builder = (Builder *)instruction;
  instruction_local = (CallInst *)impl;
  impl_local._0_4_ = opcode;
  pBStack_28 = Converter::Impl::builder(impl);
  bVar3 = get_constant_operand((Instruction *)builder,1,(uint32_t *)((long)&meta + 4));
  if (bVar3) {
    _ptr_id = std::
              unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ElementMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementMeta>_>_>
              ::operator[]((unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ElementMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementMeta>_>_>
                            *)&instruction_local[0x12].super_Instruction.attachments._M_h.
                               _M_rehash_policy._M_next_resize,(key_type *)((long)&meta + 4));
    pBVar1 = pBStack_28;
    num_rows = _ptr_id->id;
    IVar4 = spv::Builder::getDerefTypeId(pBStack_28,num_rows);
    op_1._4_4_ = spv::Builder::getNumTypeComponents(pBVar1,IVar4);
    pCVar2 = instruction_local;
    pBVar1 = pBStack_28;
    if (op_1._4_4_ < 2) {
      local_40 = num_rows;
    }
    else {
      IVar4 = Converter::Impl::get_effective_input_output_type_id
                        ((Impl *)instruction_local,_ptr_id->component_type);
      IVar4 = spv::Builder::makePointer(pBVar1,StorageClassInput,IVar4);
      pOVar5 = Converter::Impl::allocate((Impl *)pCVar2,OpAccessChain,IVar4);
      pCVar2 = instruction_local;
      offsets[1] = num_rows;
      local_50 = pOVar5;
      pVVar6 = LLVMBC::Instruction::getOperand((Instruction *)builder,3);
      Converter::Impl::get_id_for_value((Impl *)pCVar2,pVVar6,0x20);
      local_60._M_array = offsets + 1;
      local_60._M_len = 2;
      Operation::add_ids(pOVar5,&local_60);
      Converter::Impl::add((Impl *)instruction_local,local_50,false);
      local_40 = local_50->id;
    }
    if ((int)instruction_local[0x16].super_Instruction.attachments._M_h._M_element_count == 0) {
      IVar4 = spv::Builder::import(pBStack_28,"GLSL.std.450");
      *(Id *)&instruction_local[0x16].super_Instruction.attachments._M_h._M_element_count = IVar4;
    }
    pCVar2 = instruction_local;
    offsets[0] = 0;
    if ((GLSLstd450)impl_local == GLSLstd450InterpolateAtOffset) {
      memset(&i,0,8);
      bVar3 = false;
      for (operand._4_4_ = 0; pCVar2 = instruction_local, operand._4_4_ < 2;
          operand._4_4_ = operand._4_4_ + 1) {
        pVVar6 = LLVMBC::Instruction::getOperand((Instruction *)builder,operand._4_4_ + 4);
        this = &LLVMBC::dyn_cast<LLVMBC::ConstantInt>(pVVar6)->super_Constant;
        pCVar2 = instruction_local;
        if (this == (Constant *)0x0) {
          pVVar6 = LLVMBC::Instruction::getOperand((Instruction *)builder,operand._4_4_ + 4);
          IVar4 = Converter::Impl::get_id_for_value((Impl *)pCVar2,pVVar6,0);
          (&i)[operand._4_4_] = IVar4;
          IVar4 = build_attribute_offset((&i)[operand._4_4_],(Impl *)instruction_local);
          (&i)[operand._4_4_] = IVar4;
          bVar3 = true;
        }
        else {
          this_00 = LLVMBC::Constant::getUniqueInteger(this);
          iVar7 = LLVMBC::APInt::getSExtValue(this_00);
          IVar4 = spv::Builder::makeFloatConstant(pBStack_28,(float)iVar7 / 16.0,false);
          (&i)[operand._4_4_] = IVar4;
        }
      }
      if (bVar3) {
        IVar4 = spv::Builder::makeFloatType(pBStack_28,0x20);
        offsets[0] = Converter::Impl::build_vector((Impl *)pCVar2,IVar4,&i,2);
      }
      else {
        IVar4 = spv::Builder::makeFloatType(pBStack_28,0x20);
        offsets[0] = Converter::Impl::build_constant_vector((Impl *)pCVar2,IVar4,&i,2);
      }
    }
    else if ((GLSLstd450)impl_local == GLSLstd450InterpolateAtSample) {
      pVVar6 = LLVMBC::Instruction::getOperand((Instruction *)builder,4);
      offsets[0] = Converter::Impl::get_id_for_value((Impl *)pCVar2,pVVar6,0);
    }
    pCVar2 = instruction_local;
    pBVar1 = builder;
    IVar4 = Converter::Impl::get_effective_input_output_type_id
                      ((Impl *)instruction_local,_ptr_id->component_type);
    pOVar5 = Converter::Impl::allocate((Impl *)pCVar2,OpExtInst,(Value *)pBVar1,IVar4);
    Operation::add_id(pOVar5,(Id)instruction_local[0x16].super_Instruction.attachments._M_h.
                                 _M_element_count);
    Operation::add_literal(pOVar5,(GLSLstd450)impl_local);
    Operation::add_id(pOVar5,local_40);
    if (offsets[0] != 0) {
      Operation::add_id(pOVar5,offsets[0]);
    }
    Converter::Impl::add((Impl *)instruction_local,pOVar5,false);
    Converter::Impl::fixup_load_type_io
              ((Impl *)instruction_local,_ptr_id->component_type,1,(Value *)builder);
    spv::Builder::addCapability(pBStack_28,CapabilityInterpolationFunction);
    impl_local._7_1_ = true;
  }
  else {
    impl_local._7_1_ = false;
  }
  return impl_local._7_1_;
}

Assistant:

bool emit_interpolate_instruction(GLSLstd450 opcode, Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	uint32_t input_element_index;
	if (!get_constant_operand(instruction, 1, &input_element_index))
		return false;

	const auto &meta = impl.input_elements_meta[input_element_index];
	uint32_t var_id = meta.id;
	uint32_t ptr_id;

	uint32_t num_rows = builder.getNumTypeComponents(builder.getDerefTypeId(var_id));

	if (num_rows > 1)
	{
		// Need to deal with signed vs unsigned here.
		Operation *op =
			impl.allocate(spv::OpAccessChain,
			              builder.makePointer(spv::StorageClassInput,
			                                  impl.get_effective_input_output_type_id(meta.component_type)));

		op->add_ids({ var_id, impl.get_id_for_value(instruction->getOperand(3), 32) });
		impl.add(op);
		ptr_id = op->id;
	}
	else
		ptr_id = var_id;

	if (!impl.glsl_std450_ext)
		impl.glsl_std450_ext = builder.import("GLSL.std.450");

	spv::Id aux_id = 0;

	if (opcode == GLSLstd450InterpolateAtOffset)
	{
		spv::Id offsets[2] = {};
		bool is_non_const = false;
		for (unsigned i = 0; i < 2; i++)
		{
			auto *operand = instruction->getOperand(4 + i);
			auto *constant_operand = llvm::dyn_cast<llvm::ConstantInt>(operand);

			// Need to do it the tedious way, extracting bits and converting to float ...
			if (!constant_operand)
			{
				offsets[i] = impl.get_id_for_value(instruction->getOperand(4 + i));
				offsets[i] = build_attribute_offset(offsets[i], impl);
				is_non_const = true;
			}
			else
			{
				float off = float(constant_operand->getUniqueInteger().getSExtValue()) / 16.0f;
				offsets[i] = builder.makeFloatConstant(off);
			}
		}

		if (is_non_const)
			aux_id = impl.build_vector(builder.makeFloatType(32), offsets, 2);
		else
			aux_id = impl.build_constant_vector(builder.makeFloatType(32), offsets, 2);
	}
	else if (opcode == GLSLstd450InterpolateAtSample)
		aux_id = impl.get_id_for_value(instruction->getOperand(4));

	// Need to deal with signed vs unsigned here.
	Operation *op = impl.allocate(spv::OpExtInst, instruction,
	                              impl.get_effective_input_output_type_id(meta.component_type));
	op->add_id(impl.glsl_std450_ext);
	op->add_literal(opcode);
	op->add_id(ptr_id);

	if (aux_id)
		op->add_id(aux_id);

	impl.add(op);

	// Need to bitcast after we load.
	impl.fixup_load_type_io(meta.component_type, 1, instruction);
	builder.addCapability(spv::CapabilityInterpolationFunction);
	return true;
}